

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

Symbol * cs222::evaluateExpression
                   (Symbol *__return_storage_ptr__,Instruction *inst,string *expr,
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>_>_>
                   *symtab)

{
  bool bVar1;
  pointer pvVar2;
  Type local_1d4;
  string local_1d0;
  int local_1ac;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>,_true>
  _Stack_1a8;
  int resultValue;
  Type local_19c [2];
  allocator local_191;
  string local_190;
  allocator local_169;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>,_true>
  local_128;
  undefined4 local_120;
  Type local_11c [2];
  allocator local_111;
  string local_110;
  allocator local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  int local_a8;
  int local_a4;
  int secondTermValue;
  int firstTermValue;
  string secondTerm;
  string firstTerm;
  size_t opPos;
  undefined1 local_48 [8];
  smatch match;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>_>_>
  *symtab_local;
  string *expr_local;
  Instruction *inst_local;
  
  match._M_begin._M_current = (char *)symtab;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)local_48);
  std::
  regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
            (expr,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)local_48,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)Parser::op_regex_abi_cxx11_,0);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::position((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_48,0);
  std::__cxx11::string::substr((ulong)((long)&secondTerm.field_2 + 8),(ulong)expr);
  std::__cxx11::string::substr((ulong)&secondTermValue,(ulong)expr);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&secondTerm.field_2 + 8),
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                     Parser::label_regex_abi_cxx11_,0);
  if (bVar1) {
    bVar1 = hashtableContains<std::__cxx11::string,cs222::Symbol>
                      ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>_>_>
                        *)match._M_begin._M_current,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&secondTerm.field_2 + 8));
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e8,"Undefined symbol: ",&local_e9);
      std::operator+(&local_c8,&local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&secondTerm.field_2 + 8));
      Instruction::addError(inst,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_110,"",&local_111);
      local_11c[1] = 0;
      local_11c[0] = ABSOLUTE;
      Symbol::Symbol(__return_storage_ptr__,&local_110,(int *)(local_11c + 1),local_11c);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      goto LAB_0015b234;
    }
    local_128._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>_>_>
                 *)match._M_begin._M_current,(key_type *)((long)&secondTerm.field_2 + 8));
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>,_false,_true>
                           *)&local_128);
    local_a4 = Symbol::getValue(&pvVar2->second);
  }
  else {
    local_a4 = std::__cxx11::stoi((string *)((long)&secondTerm.field_2 + 8),(size_t *)0x0,10);
  }
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &secondTermValue,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                     Parser::label_regex_abi_cxx11_,0);
  if (bVar1) {
    bVar1 = hashtableContains<std::__cxx11::string,cs222::Symbol>
                      ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>_>_>
                        *)match._M_begin._M_current,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &secondTermValue);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_168,"Undefined symbol: ",&local_169);
      std::operator+(&local_148,&local_168,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &secondTermValue);
      Instruction::addError(inst,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_190,"",&local_191);
      local_19c[1] = 0;
      local_19c[0] = ABSOLUTE;
      Symbol::Symbol(__return_storage_ptr__,&local_190,(int *)(local_19c + 1),local_19c);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
      goto LAB_0015b234;
    }
    _Stack_1a8._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>_>_>
                 *)match._M_begin._M_current,(key_type *)&secondTermValue);
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>,_false,_true>
                           *)&stack0xfffffffffffffe58);
    local_a8 = Symbol::getValue(&pvVar2->second);
  }
  else {
    local_a8 = std::__cxx11::stoi((string *)&secondTermValue,(size_t *)0x0,10);
  }
  local_1ac = local_a4 + local_a8;
  Instruction::getLabel_abi_cxx11_(&local_1d0,inst);
  local_1d4 = ABSOLUTE;
  Symbol::Symbol(__return_storage_ptr__,&local_1d0,&local_1ac,&local_1d4);
  std::__cxx11::string::~string((string *)&local_1d0);
LAB_0015b234:
  local_120 = 1;
  std::__cxx11::string::~string((string *)&secondTermValue);
  std::__cxx11::string::~string((string *)(secondTerm.field_2._M_local_buf + 8));
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Symbol evaluateExpression(
            Instruction& inst,
            const std::string& expr,
            const std::unordered_map<std::string, Symbol>& symtab)
    {
        std::smatch match;
        std::regex_search(expr, match, Parser::op_regex);
        size_t opPos = match.position();
        std::string firstTerm = expr.substr(0, opPos);
        std::string secondTerm = expr.substr(opPos+1);

        int firstTermValue, secondTermValue;
        if (std::regex_match(firstTerm, Parser::label_regex))
        {
            if (!hashtableContains(symtab, firstTerm))
            {
                inst.addError(std::string("Undefined symbol: ") +
                        firstTerm);
                return Symbol("", 0, Symbol::ABSOLUTE);
            }
            firstTermValue = symtab.find(firstTerm)->second.getValue();
        }
        else
        {
            firstTermValue = std::stoi(firstTerm);
        }
        if (std::regex_match(secondTerm, Parser::label_regex))
        {
            if (!hashtableContains(symtab, secondTerm))
            {
                inst.addError(std::string("Undefined symbol: ") +
                        secondTerm);
                return Symbol("", 0, Symbol::ABSOLUTE);
            }
            secondTermValue = symtab.find(secondTerm)->second.getValue();
        }
        else
        {
            secondTermValue = std::stoi(secondTerm);
        }

        int resultValue = firstTermValue + secondTermValue;
        return Symbol(inst.getLabel(), resultValue, Symbol::ABSOLUTE);
    }